

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_cas2(m68k_info *info,int size)

{
  uint uVar1;
  int iVar2;
  m68k_reg mVar3;
  
  MCInst_setOpcode(info->inst,0x2c);
  (info->extension).op_count = '\x03';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = size;
  uVar1 = peek_imm_32(info);
  iVar2 = instruction_is_valid(info,uVar1 & 0xffff);
  if (iVar2 != 0) {
    mVar3 = peek_imm_32(info);
    info->pc = info->pc + 4;
    (info->extension).operands[0].type = M68K_OP_REG_PAIR;
    (info->extension).operands[0].address_mode = M68K_AM_NONE;
    (info->extension).operands[0].field_0.reg = mVar3 >> 0x10 & M68K_REG_D6;
    (info->extension).operands[0].field_0.reg_pair.reg_1 = mVar3 & M68K_REG_D6;
    (info->extension).operands[1].type = M68K_OP_REG_PAIR;
    (info->extension).operands[1].address_mode = M68K_AM_NONE;
    (info->extension).operands[1].field_0.reg = mVar3 >> 0x16 & M68K_REG_D6;
    (info->extension).operands[1].field_0.reg_pair.reg_1 = mVar3 >> 6 & M68K_REG_D6;
    (info->extension).operands[2].type = M68K_OP_REG_PAIR;
    (info->extension).operands[2].address_mode = M68K_AM_NONE;
    (info->extension).operands[2].field_0.reg = mVar3 >> 0x1c;
    (info->extension).operands[2].field_0.reg_pair.reg_1 = mVar3 >> 0xc & M68K_REG_A6;
  }
  return;
}

Assistant:

static void build_cas2(m68k_info *info, int size)
{
	uint word3;
	uint extension;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k_op* op2;
	cs_m68k* ext = build_init_op(info, M68K_INS_CAS2, 3, size);
	int reg_0, reg_1;

	/* cas2 is the only 3 words instruction, word2 and word3 have the same motif bits to check */
	word3 = peek_imm_32(info) & 0xffff;
	if (!instruction_is_valid(info, word3))
		return;

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];
	op2 = &ext->operands[2];

	extension = read_imm_32(info);

	op0->address_mode = M68K_AM_NONE;
	op0->type = M68K_OP_REG_PAIR;
	op0->reg_pair.reg_0 = (extension >> 16) & 7;
	op0->reg_pair.reg_1 = extension & 7;

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG_PAIR;
	op1->reg_pair.reg_0 = (extension >> 22) & 7;
	op1->reg_pair.reg_1 = (extension >> 6) & 7;

	reg_0 = (extension >> 28) & 7;
	reg_1 = (extension >> 12) & 7;

	op2->address_mode = M68K_AM_NONE;
	op2->type = M68K_OP_REG_PAIR;
	op2->reg_pair.reg_0 = reg_0 + (BIT_1F(extension) ? 8 : 0);
	op2->reg_pair.reg_1 = reg_1 + (BIT_F(extension) ? 8 : 0);
}